

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O0

QDebugIfHasDebugStreamContainer<QHash<QString,_QVariant>,_QString,_QVariant>
operator<<(QDebug *debug,QHash<QString,_QVariant> *hash)

{
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebug *unaff_retaddr;
  QDebug in_stack_fffffffffffffff0;
  QDebug *this;
  
  this = *(QDebug **)(in_FS_OFFSET + 0x28);
  QDebug::QDebug((QDebug *)&stack0xfffffffffffffff0,(QDebug *)in_RDI);
  QtPrivate::printAssociativeContainer<QHash<QString,QVariant>>
            (unaff_retaddr,(char *)this,(QHash<QString,_QVariant> *)in_stack_fffffffffffffff0.stream
            );
  QDebug::~QDebug(this);
  if (*(QDebug **)(in_FS_OFFSET + 0x28) == this) {
    return (QDebugIfHasDebugStreamContainer<QHash<QString,_QVariant>,_QString,_QVariant>)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebugIfHasDebugStreamContainer<QHash<Key, T>, Key, T> operator<<(QDebug debug, const QHash<Key, T> &hash)
{
    return QtPrivate::printAssociativeContainer(std::move(debug), "QHash", hash);
}